

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O2

Vec3f __thiscall embree::XMLLoader::load<embree::Vec3<float>>(XMLLoader *this,Ref<embree::XML> *xml)

{
  Token *this_00;
  runtime_error *this_01;
  long *in_RDX;
  float fVar1;
  float fVar2;
  undefined4 extraout_XMM0_Db;
  Vec3f VVar3;
  string local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  this_00 = *(Token **)(*in_RDX + 0x98);
  if (*(long *)(*in_RDX + 0xa0) - (long)this_00 == 0xd8) {
    fVar1 = Token::Float(this_00,true);
    fVar2 = Token::Float((Token *)(*(long *)(*in_RDX + 0x98) + 0x48),true);
    VVar3.field_0._0_4_ = Token::Float((Token *)(*(long *)(*in_RDX + 0x98) + 0x90),true);
    VVar3.field_0.field_0.y = (float)extraout_XMM0_Db;
    *(float *)&(this->path).filename._M_dataplus._M_p = fVar1;
    *(float *)((long)&(this->path).filename._M_dataplus._M_p + 4) = fVar2;
    *(float *)&(this->path).filename._M_string_length = VVar3.field_0._0_4_;
    VVar3.field_0.field_0.z = fVar2;
    return (Vec3f)VVar3.field_0;
  }
  this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
  ParseLocation::str_abi_cxx11_(&local_58,(ParseLocation *)(*in_RDX + 0x10));
  std::operator+(&local_38,&local_58,": wrong float3 body");
  std::runtime_error::runtime_error(this_01,(string *)&local_38);
  __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Vec3f XMLLoader::load<Vec3f>(const Ref<XML>& xml) {
    if (xml->body.size() != 3) THROW_RUNTIME_ERROR(xml->loc.str()+": wrong float3 body");
    return Vec3f(xml->body[0].Float(),xml->body[1].Float(),xml->body[2].Float());
  }